

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O2

Violation __thiscall
mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>::
ComputeViolation<std::vector<double,std::allocator<double>>>
          (AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>> *this,
          vector<double,_std::allocator<double>_> *x,bool logical)

{
  double dVar1;
  bool bVar2;
  undefined3 in_register_00000011;
  undefined4 in_register_00000014;
  longdouble in_ST0;
  double dVar3;
  double dVar4;
  Violation VVar5;
  
  QuadAndLinTerms::ComputeValue<std::vector<double,std::allocator<double>>>
            ((longdouble *)(this + 0x20),(QuadAndLinTerms *)x,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_register_00000014,CONCAT31(in_register_00000011,logical)));
  dVar1 = (double)in_ST0;
  dVar4 = *(double *)(this + 0x1d8);
  if (CONCAT31(in_register_00000011,logical) == 0) {
    if (dVar1 <= dVar4) {
      dVar3 = dVar1 - dVar4;
      if (dVar1 - dVar4 <= -INFINITY - dVar1) {
        dVar3 = -INFINITY - dVar1;
      }
      dVar4 = 0.0;
    }
    else {
      dVar3 = dVar1 - dVar4;
    }
  }
  else {
    bVar2 = dVar4 < dVar1;
    dVar4 = 1.0;
    dVar3 = (double)(-(ulong)bVar2 & 0x3ff0000000000000);
  }
  VVar5.valX_ = dVar4;
  VVar5.viol_ = dVar3;
  return VVar5;
}

Assistant:

Violation
  ComputeViolation(const VarInfo& x, bool logical=false) const {
    double bd = Body::ComputeValue(x);
    if (!logical) {
      if (RhsOrRange::lb() > bd)
        return {RhsOrRange::lb() - bd, RhsOrRange::lb()};
      if (bd > RhsOrRange::ub())
        return {bd - RhsOrRange::ub(), RhsOrRange::ub()};
      return
      {std::max( // negative. Same for strict cmp?
                 RhsOrRange::lb() - bd, bd - RhsOrRange::ub()),
            0.0};
    }
    return {double(!RhsOrRange::is_valid(bd)), 1.0};
  }